

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O0

int WebPWritePGM(FILE *fout,WebPDecBuffer *buffer)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  long in_RSI;
  FILE *in_RDI;
  int y;
  int ok;
  int a_height;
  int uv_height;
  int uv_width;
  uint8_t *src_a;
  uint8_t *src_v;
  uint8_t *src_u;
  uint8_t *src_y;
  WebPYUVABuffer *yuv;
  int height;
  int width;
  int local_60;
  int local_5c;
  uint local_58;
  void *local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  uint local_4;
  
  if ((in_RDI == (FILE *)0x0) || (in_RSI == 0)) {
    local_4 = 0;
  }
  else {
    uVar1 = *(uint *)(in_RSI + 4);
    iVar2 = *(int *)(in_RSI + 8);
    local_30 = *(void **)(in_RSI + 0x10);
    local_38 = *(void **)(in_RSI + 0x18);
    local_40 = *(void **)(in_RSI + 0x20);
    local_48 = *(void **)(in_RSI + 0x28);
    iVar3 = (int)(uVar1 + 1) / 2;
    iVar4 = (iVar2 + 1) / 2;
    local_60 = iVar2;
    if (local_48 == (void *)0x0) {
      local_60 = 0;
    }
    local_58 = 1;
    if (((local_30 == (void *)0x0) || (local_38 == (void *)0x0)) || (local_40 == (void *)0x0)) {
      local_4 = 0;
    }
    else {
      fprintf(in_RDI,"P5\n%d %d\n255\n",(ulong)(uVar1 + 1 & 0xfffffffe),
              (ulong)(uint)(iVar2 + iVar4 + local_60));
      for (local_5c = 0; local_58 != 0 && local_5c < iVar2; local_5c = local_5c + 1) {
        sVar6 = fwrite(local_30,(long)(int)uVar1,1,in_RDI);
        local_58 = sVar6 == 1 & local_58;
        if ((uVar1 & 1) != 0) {
          fputc(0,in_RDI);
        }
        local_30 = (void *)((long)local_30 + (long)*(int *)(in_RSI + 0x30));
      }
      local_5c = 0;
      for (; local_58 != 0 && local_5c < iVar4;
          local_58 = (uint)(sVar5 == 1) & sVar6 == 1 & local_58) {
        sVar6 = fwrite(local_38,(long)iVar3,1,in_RDI);
        sVar5 = fwrite(local_40,(long)iVar3,1,in_RDI);
        local_38 = (void *)((long)local_38 + (long)*(int *)(in_RSI + 0x34));
        local_40 = (void *)((long)local_40 + (long)*(int *)(in_RSI + 0x38));
        local_5c = local_5c + 1;
      }
      for (local_5c = 0; local_58 != 0 && local_5c < local_60; local_5c = local_5c + 1) {
        sVar6 = fwrite(local_48,(long)(int)uVar1,1,in_RDI);
        local_58 = sVar6 == 1 & local_58;
        if ((uVar1 & 1) != 0) {
          fputc(0,in_RDI);
        }
        local_48 = (void *)((long)local_48 + (long)*(int *)(in_RSI + 0x3c));
      }
      local_4 = local_58;
    }
  }
  return local_4;
}

Assistant:

int WebPWritePGM(FILE* fout, const WebPDecBuffer* const buffer) {
  if (fout == NULL || buffer == NULL) {
    return 0;
  } else {
    const int width = buffer->width;
    const int height = buffer->height;
    const WebPYUVABuffer* const yuv = &buffer->u.YUVA;
    const uint8_t* src_y = yuv->y;
    const uint8_t* src_u = yuv->u;
    const uint8_t* src_v = yuv->v;
    const uint8_t* src_a = yuv->a;
    const int uv_width = (width + 1) / 2;
    const int uv_height = (height + 1) / 2;
    const int a_height = (src_a != NULL) ? height : 0;
    int ok = 1;
    int y;

    if (src_y == NULL || src_u == NULL || src_v == NULL) return 0;

    fprintf(fout, "P5\n%d %d\n255\n",
            (width + 1) & ~1, height + uv_height + a_height);
    for (y = 0; ok && y < height; ++y) {
      ok &= (fwrite(src_y, width, 1, fout) == 1);
      if (width & 1) fputc(0, fout);    // padding byte
      src_y += yuv->y_stride;
    }
    for (y = 0; ok && y < uv_height; ++y) {
      ok &= (fwrite(src_u, uv_width, 1, fout) == 1);
      ok &= (fwrite(src_v, uv_width, 1, fout) == 1);
      src_u += yuv->u_stride;
      src_v += yuv->v_stride;
    }
    for (y = 0; ok && y < a_height; ++y) {
      ok &= (fwrite(src_a, width, 1, fout) == 1);
      if (width & 1) fputc(0, fout);    // padding byte
      src_a += yuv->a_stride;
    }
    return ok;
  }
}